

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void R_DrawSpanMaskedP_C(void)

{
  byte bVar1;
  byte bVar2;
  BYTE *pBVar3;
  lighttable_t *plVar4;
  dsfixed_t dVar5;
  dsfixed_t dVar6;
  BYTE *pBVar7;
  int iVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  dsfixed_t dVar12;
  dsfixed_t dVar13;
  int iVar14;
  
  pBVar7 = ds_source;
  dVar6 = ds_ystep;
  dVar5 = ds_xstep;
  plVar4 = ds_colormap;
  pBVar3 = dc_destorg;
  iVar8 = ylookup[ds_y] + ds_x1;
  iVar14 = (ds_x2 - ds_x1) + 1;
  if (ds_ybits == 6 && ds_xbits == 6) {
    lVar10 = 0;
    dVar12 = ds_xfrac;
    dVar13 = ds_yfrac;
    do {
      uVar11 = (ulong)pBVar7[dVar13 >> 0x1a | dVar12 >> 0x14 & 0xffffffc0];
      if (uVar11 != 0) {
        pBVar3[lVar10 + iVar8] = plVar4[uVar11];
      }
      dVar12 = dVar12 + dVar5;
      dVar13 = dVar13 + dVar6;
      lVar10 = lVar10 + 1;
    } while (iVar14 != (int)lVar10);
  }
  else {
    bVar2 = (byte)ds_ybits;
    bVar1 = 0x20 - bVar2;
    bVar9 = (byte)ds_xbits;
    lVar10 = 0;
    dVar12 = ds_xfrac;
    dVar13 = ds_yfrac;
    do {
      uVar11 = (ulong)pBVar7[(int)((dVar13 >> (bVar1 & 0x1f)) +
                                  (dVar12 >> (bVar1 - bVar9 & 0x1f) &
                                  ~(-1 << (bVar9 & 0x1f)) << (bVar2 & 0x1f)))];
      if (uVar11 != 0) {
        pBVar3[lVar10 + iVar8] = plVar4[uVar11];
      }
      dVar12 = dVar12 + dVar5;
      dVar13 = dVar13 + dVar6;
      lVar10 = lVar10 + 1;
    } while (iVar14 != (int)lVar10);
  }
  return;
}

Assistant:

void R_DrawSpanMaskedP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			BYTE texdata;

			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			texdata = source[spot];
			if (texdata != 0)
			{
				*dest = colormap[texdata];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			BYTE texdata;
		
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			texdata = source[spot];
			if (texdata != 0)
			{
				*dest = colormap[texdata];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}